

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_tests.hpp
# Opt level: O2

string * __thiscall
iuutil::TestNameRemoveIndexName_abi_cxx11_(string *__return_storage_ptr__,iuutil *this,char *name)

{
  char *pcVar1;
  allocator<char> local_11;
  
  pcVar1 = strrchr((char *)this,0x2f);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)this,&local_11);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,this,pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string TestNameRemoveIndexName(const char* name)
{
    const char* const p = strrchr(name, '/');
    if( p == NULL )
    {
        return name;
    }
    return ::std::string(name, p);
}